

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FragmentStamp.cpp
# Opt level: O2

void __thiscall OpenMD::FragmentStamp::checkConstraints(FragmentStamp *this)

{
  int iVar1;
  int iVar2;
  long lVar3;
  pointer piVar4;
  int __tmp;
  ostream *poVar5;
  OpenMDException *pOVar6;
  pointer ppCVar7;
  iterator iVar8;
  pointer ppCVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  pair<int,_int> constraintPair;
  string local_1f8;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  allConstraints;
  ostringstream oss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  ppCVar7 = (this->constraintStamps_).
            super__Vector_base<OpenMD::ConstraintStamp_*,_std::allocator<OpenMD::ConstraintStamp_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppCVar9 = (this->constraintStamps_).
            super__Vector_base<OpenMD::ConstraintStamp_*,_std::allocator<OpenMD::ConstraintStamp_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  lVar13 = ((long)ppCVar9 - (long)ppCVar7 >> 3) + 1;
  lVar14 = 0;
  do {
    lVar13 = lVar13 + -1;
    if (lVar13 == 0) {
      allConstraints._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &allConstraints._M_t._M_impl.super__Rb_tree_header._M_header;
      allConstraints._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      allConstraints._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      allConstraints._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      lVar13 = 0;
      uVar12 = 0;
      allConstraints._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           allConstraints._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      while( true ) {
        uVar10 = (long)ppCVar9 - (long)ppCVar7 >> 3;
        if (uVar10 <= uVar12) {
          piVar4 = (this->atom2Rigidbody).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar14 = uVar10 + 1;
          lVar13 = 0;
          do {
            lVar14 = lVar14 + -1;
            if (lVar14 == 0) {
              std::
              _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
              ::~_Rb_tree(&allConstraints._M_t);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
              return;
            }
            lVar3 = *(long *)((long)ppCVar7 + (lVar13 >> 0x1d));
            lVar13 = lVar13 + 0x100000000;
          } while (piVar4[*(int *)(lVar3 + 0xd0)] != piVar4[*(int *)(lVar3 + 0xd4)]);
          poVar5 = std::operator<<((ostream *)&oss,"Error in Fragment ");
          std::__cxx11::string::string((string *)&local_1f8,(string *)&(this->Name).data_);
          poVar5 = std::operator<<(poVar5,(string *)&local_1f8);
          poVar5 = std::operator<<(poVar5,": ");
          poVar5 = std::operator<<(poVar5,"constraint(");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,*(int *)(lVar3 + 0xd0));
          poVar5 = std::operator<<(poVar5,", ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,*(int *)(lVar3 + 0xd4));
          poVar5 = std::operator<<(poVar5,") belong to same rigidbody ");
          poVar5 = (ostream *)
                   std::ostream::operator<<
                             (poVar5,(this->atom2Rigidbody).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start[*(int *)(lVar3 + 0xd0)]);
          std::operator<<(poVar5,"\n");
          std::__cxx11::string::~string((string *)&local_1f8);
          pOVar6 = (OpenMDException *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          OpenMDException::OpenMDException(pOVar6,&local_1f8);
          __cxa_throw(pOVar6,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
        }
        lVar14 = *(long *)((long)ppCVar7 + (lVar13 >> 0x1d));
        iVar1 = *(int *)(lVar14 + 0xd0);
        constraintPair.second = *(int *)(lVar14 + 0xd4);
        constraintPair.first = iVar1;
        if (constraintPair.second < iVar1) {
          constraintPair.first = constraintPair.second;
          constraintPair.second = iVar1;
        }
        iVar8 = std::
                _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                ::find((_Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                        *)&allConstraints,&constraintPair);
        if ((_Rb_tree_header *)iVar8._M_node != &allConstraints._M_t._M_impl.super__Rb_tree_header)
        break;
        std::
        _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
        ::_M_insert_unique<std::pair<int,int>const&>
                  ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                    *)&allConstraints,&constraintPair);
        uVar12 = uVar12 + 1;
        ppCVar7 = (this->constraintStamps_).
                  super__Vector_base<OpenMD::ConstraintStamp_*,_std::allocator<OpenMD::ConstraintStamp_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppCVar9 = (this->constraintStamps_).
                  super__Vector_base<OpenMD::ConstraintStamp_*,_std::allocator<OpenMD::ConstraintStamp_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        lVar13 = lVar13 + 0x100000000;
      }
      poVar5 = std::operator<<((ostream *)&oss,"Error in Fragment ");
      std::__cxx11::string::string((string *)&local_1f8,(string *)&(this->Name).data_);
      poVar5 = std::operator<<(poVar5,(string *)&local_1f8);
      poVar5 = std::operator<<(poVar5,": ");
      poVar5 = std::operator<<(poVar5,"constraint(");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar8._M_node[1]._M_color);
      poVar5 = std::operator<<(poVar5,", ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,*(int *)&iVar8._M_node[1].field_0x4);
      std::operator<<(poVar5,") appears multiple times\n");
      std::__cxx11::string::~string((string *)&local_1f8);
      pOVar6 = (OpenMDException *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      OpenMDException::OpenMDException(pOVar6,&local_1f8);
      __cxa_throw(pOVar6,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    lVar3 = *(long *)((long)ppCVar7 + (lVar14 >> 0x1d));
    iVar1 = *(int *)(lVar3 + 0xd0);
    iVar11 = (int)((ulong)((long)(this->atomStamps_).
                                 super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->atomStamps_).
                                super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3);
  } while ((((iVar1 < iVar11) && (-1 < iVar1)) && (iVar2 = *(int *)(lVar3 + 0xd4), iVar1 != iVar2))
          && ((iVar2 < iVar11 && (lVar14 = lVar14 + 0x100000000, -1 < iVar2))));
  poVar5 = std::operator<<((ostream *)&oss,"Error in Fragment ");
  std::__cxx11::string::string((string *)&allConstraints,(string *)&(this->Name).data_);
  poVar5 = std::operator<<(poVar5,(string *)&allConstraints);
  poVar5 = std::operator<<(poVar5,": constraint(");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,*(int *)(lVar3 + 0xd0));
  poVar5 = std::operator<<(poVar5,", ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,*(int *)(lVar3 + 0xd4));
  std::operator<<(poVar5,") is invalid\n");
  std::__cxx11::string::~string((string *)&allConstraints);
  pOVar6 = (OpenMDException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  OpenMDException::OpenMDException(pOVar6,(string *)&allConstraints);
  __cxa_throw(pOVar6,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
}

Assistant:

void FragmentStamp::checkConstraints() {
    std::ostringstream oss;
    // make sure index is not out of range
    int natoms = getNAtoms();
    for (std::size_t i = 0; i < getNConstraints(); ++i) {
      ConstraintStamp* constraintStamp = getConstraintStamp(i);
      if (constraintStamp->getA() > natoms - 1 || constraintStamp->getA() < 0 ||
          constraintStamp->getB() > natoms - 1 || constraintStamp->getB() < 0 ||
          constraintStamp->getA() == constraintStamp->getB()) {
        oss << "Error in Fragment " << getName() << ": constraint("
            << constraintStamp->getA() << ", " << constraintStamp->getB()
            << ") is invalid\n";
        throw OpenMDException(oss.str());
      }
    }

    // make sure constraints are unique
    std::set<std::pair<int, int>> allConstraints;
    for (std::size_t i = 0; i < getNConstraints(); ++i) {
      ConstraintStamp* constraintStamp = getConstraintStamp(i);
      std::pair<int, int> constraintPair(constraintStamp->getA(),
                                         constraintStamp->getB());
      // make sure constraintPair.first is always less than or equal to
      // constraintPair.third
      if (constraintPair.first > constraintPair.second) {
        std::swap(constraintPair.first, constraintPair.second);
      }

      std::set<std::pair<int, int>>::iterator iter =
          allConstraints.find(constraintPair);
      if (iter != allConstraints.end()) {
        oss << "Error in Fragment " << getName() << ": "
            << "constraint(" << iter->first << ", " << iter->second
            << ") appears multiple times\n";
        throw OpenMDException(oss.str());
      } else {
        allConstraints.insert(constraintPair);
      }
    }

    // make sure atoms belong to same rigidbody are not constrained to
    // each other
    for (std::size_t i = 0; i < getNConstraints(); ++i) {
      ConstraintStamp* constraintStamp = getConstraintStamp(i);
      if (atom2Rigidbody[constraintStamp->getA()] ==
          atom2Rigidbody[constraintStamp->getB()]) {
        oss << "Error in Fragment " << getName() << ": "
            << "constraint(" << constraintStamp->getA() << ", "
            << constraintStamp->getB() << ") belong to same rigidbody "
            << atom2Rigidbody[constraintStamp->getA()] << "\n";
        throw OpenMDException(oss.str());
      }
    }
  }